

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O1

int Abc_NtkCollectPiPos_int(Abc_Obj_t *pBox,Abc_Ntk_t *pNtk,Vec_Ptr_t *vLiMaps,Vec_Ptr_t *vLoMaps)

{
  ulong uVar1;
  undefined4 uVar2;
  uint uVar3;
  long *plVar4;
  long lVar5;
  void *pvVar6;
  int iVar7;
  int *piVar8;
  Vec_Ptr_t *pVVar9;
  void **ppvVar10;
  Vec_Ptr_t *pVVar11;
  Vec_Ptr_t *extraout_RDX;
  Vec_Ptr_t *extraout_RDX_00;
  Vec_Ptr_t *extraout_RDX_01;
  int iVar12;
  long lVar13;
  
  pVVar11 = vLiMaps;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar12 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar12 + 500;
    iVar7 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar7) {
      piVar8 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar8;
      if (piVar8 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar7;
      pVVar11 = extraout_RDX;
    }
    if (-500 < iVar12) {
      memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
      pVVar11 = extraout_RDX_00;
    }
    (pNtk->vTravIds).nSize = iVar7;
  }
  iVar12 = pNtk->nTravIds;
  pNtk->nTravIds = iVar12 + 1;
  if (0x3ffffffe < iVar12) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                  ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar9 = pNtk->vPis;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      plVar4 = *(long **)(*(long *)(*(long *)(*pVVar9->pArray[lVar13] + 0x20) + 8) +
                         (long)**(int **)((long)pVVar9->pArray[lVar13] + 0x30) * 8);
      lVar5 = *plVar4;
      uVar2 = *(undefined4 *)(lVar5 + 0xd8);
      iVar12 = (int)plVar4[2];
      Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar12 + 1,(int)pVVar11);
      if (((long)iVar12 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar12)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)(*(long *)(lVar5 + 0xe8) + (long)iVar12 * 4) = uVar2;
      lVar13 = lVar13 + 1;
      pVVar9 = pNtk->vPis;
      pVVar11 = extraout_RDX_01;
    } while (lVar13 < pVVar9->nSize);
  }
  if (pBox != (Abc_Obj_t *)0x0) {
    if (0 < (pBox->vFanins).nSize) {
      lVar13 = 0;
      do {
        pvVar6 = pBox->pNtk->vObjs->pArray[(pBox->vFanins).pArray[lVar13]];
        uVar3 = vLiMaps->nCap;
        if (vLiMaps->nSize == uVar3) {
          if ((int)uVar3 < 0x10) {
            if (vLiMaps->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(vLiMaps->pArray,0x80);
            }
            vLiMaps->pArray = ppvVar10;
            iVar12 = 0x10;
          }
          else {
            iVar12 = uVar3 * 2;
            if (iVar12 <= (int)uVar3) goto LAB_001b82cd;
            if (vLiMaps->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc((ulong)uVar3 << 4);
            }
            else {
              ppvVar10 = (void **)realloc(vLiMaps->pArray,(ulong)uVar3 << 4);
            }
            vLiMaps->pArray = ppvVar10;
          }
          vLiMaps->nCap = iVar12;
        }
LAB_001b82cd:
        iVar12 = vLiMaps->nSize;
        vLiMaps->nSize = iVar12 + 1;
        vLiMaps->pArray[iVar12] = pvVar6;
        lVar13 = lVar13 + 1;
      } while (lVar13 < (pBox->vFanins).nSize);
    }
    pVVar11 = pNtk->vPis;
    if (0 < pVVar11->nSize) {
      lVar13 = 0;
      do {
        pvVar6 = pVVar11->pArray[lVar13];
        uVar3 = vLoMaps->nCap;
        if (vLoMaps->nSize == uVar3) {
          if ((int)uVar3 < 0x10) {
            if (vLoMaps->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(vLoMaps->pArray,0x80);
            }
            vLoMaps->pArray = ppvVar10;
            iVar12 = 0x10;
          }
          else {
            iVar12 = uVar3 * 2;
            if (iVar12 <= (int)uVar3) goto LAB_001b837a;
            if (vLoMaps->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc((ulong)uVar3 << 4);
            }
            else {
              ppvVar10 = (void **)realloc(vLoMaps->pArray,(ulong)uVar3 << 4);
            }
            vLoMaps->pArray = ppvVar10;
          }
          vLoMaps->nCap = iVar12;
        }
LAB_001b837a:
        iVar12 = vLoMaps->nSize;
        vLoMaps->nSize = iVar12 + 1;
        vLoMaps->pArray[iVar12] = pvVar6;
        lVar13 = lVar13 + 1;
        pVVar11 = pNtk->vPis;
      } while (lVar13 < pVVar11->nSize);
    }
  }
  pVVar11 = pNtk->vPos;
  if (pVVar11->nSize < 1) {
    iVar12 = 0;
  }
  else {
    lVar13 = 0;
    iVar12 = 0;
    do {
      iVar7 = Abc_NtkCollectPiPos_rec
                        (*(Abc_Obj_t **)
                          (*(long *)(*(long *)(*pVVar11->pArray[lVar13] + 0x20) + 8) +
                          (long)**(int **)((long)pVVar11->pArray[lVar13] + 0x20) * 8),vLiMaps,
                         vLoMaps);
      iVar12 = iVar12 + iVar7;
      lVar13 = lVar13 + 1;
      pVVar11 = pNtk->vPos;
    } while (lVar13 < pVVar11->nSize);
  }
  if (pBox != (Abc_Obj_t *)0x0) {
    pVVar11 = pNtk->vPos;
    if (0 < pVVar11->nSize) {
      lVar13 = 0;
      do {
        pvVar6 = pVVar11->pArray[lVar13];
        uVar3 = vLiMaps->nCap;
        if (vLiMaps->nSize == uVar3) {
          if ((int)uVar3 < 0x10) {
            if (vLiMaps->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(vLiMaps->pArray,0x80);
            }
            vLiMaps->pArray = ppvVar10;
            iVar7 = 0x10;
          }
          else {
            iVar7 = uVar3 * 2;
            if (iVar7 <= (int)uVar3) goto LAB_001b8485;
            if (vLiMaps->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc((ulong)uVar3 << 4);
            }
            else {
              ppvVar10 = (void **)realloc(vLiMaps->pArray,(ulong)uVar3 << 4);
            }
            vLiMaps->pArray = ppvVar10;
          }
          vLiMaps->nCap = iVar7;
        }
LAB_001b8485:
        iVar7 = vLiMaps->nSize;
        vLiMaps->nSize = iVar7 + 1;
        vLiMaps->pArray[iVar7] = pvVar6;
        lVar13 = lVar13 + 1;
        pVVar11 = pNtk->vPos;
      } while (lVar13 < pVVar11->nSize);
    }
    if (0 < (pBox->vFanouts).nSize) {
      lVar13 = 0;
      do {
        pvVar6 = pBox->pNtk->vObjs->pArray[(pBox->vFanouts).pArray[lVar13]];
        uVar3 = vLoMaps->nCap;
        if (vLoMaps->nSize == uVar3) {
          if ((int)uVar3 < 0x10) {
            if (vLoMaps->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc(0x80);
            }
            else {
              ppvVar10 = (void **)realloc(vLoMaps->pArray,0x80);
            }
            vLoMaps->pArray = ppvVar10;
            iVar7 = 0x10;
          }
          else {
            iVar7 = uVar3 * 2;
            if (iVar7 <= (int)uVar3) goto LAB_001b8545;
            if (vLoMaps->pArray == (void **)0x0) {
              ppvVar10 = (void **)malloc((ulong)uVar3 << 4);
            }
            else {
              ppvVar10 = (void **)realloc(vLoMaps->pArray,(ulong)uVar3 << 4);
            }
            vLoMaps->pArray = ppvVar10;
          }
          vLoMaps->nCap = iVar7;
        }
LAB_001b8545:
        iVar7 = vLoMaps->nSize;
        vLoMaps->nSize = iVar7 + 1;
        vLoMaps->pArray[iVar7] = pvVar6;
        lVar13 = lVar13 + 1;
      } while (lVar13 < (pBox->vFanouts).nSize);
    }
    iVar12 = iVar12 + 1;
  }
  return iVar12;
}

Assistant:

int Abc_NtkCollectPiPos_int( Abc_Obj_t * pBox, Abc_Ntk_t * pNtk, Vec_Ptr_t * vLiMaps, Vec_Ptr_t * vLoMaps )
{
    Abc_Obj_t * pObj; 
    int i, Counter = 0;
    // mark primary inputs
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NodeSetTravIdCurrent( Abc_ObjFanout0(pObj) );
    // add primary inputs
    if ( pBox )
    {
        Abc_ObjForEachFanin( pBox, pObj, i )
            Vec_PtrPush( vLiMaps, pObj );
        Abc_NtkForEachPi( pNtk, pObj, i )
            Vec_PtrPush( vLoMaps, pObj );
    }
    // visit primary outputs
    Abc_NtkForEachPo( pNtk, pObj, i )
        Counter += Abc_NtkCollectPiPos_rec( Abc_ObjFanin0(pObj), vLiMaps, vLoMaps );
    // add primary outputs
    if ( pBox )
    {
        Abc_NtkForEachPo( pNtk, pObj, i )
            Vec_PtrPush( vLiMaps, pObj );
        Abc_ObjForEachFanout( pBox, pObj, i )
            Vec_PtrPush( vLoMaps, pObj );
        Counter++;
    }
    return Counter;
}